

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

void __thiscall
HighsHashTable<unsigned_long,_void>::~HighsHashTable(HighsHashTable<unsigned_long,_void> *this)

{
  pointer *__ptr;
  
  if (*(void **)(this + 8) != (void *)0x0) {
    operator_delete__(*(void **)(this + 8));
  }
  *(undefined8 *)(this + 8) = 0;
  if (*(void **)this != (void *)0x0) {
    operator_delete(*(void **)this);
  }
  *(undefined8 *)this = 0;
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }